

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_settypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer typetag)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    ((pSVar2->super_SQObject)._unVal.pClass)->_typetag = typetag;
  }
  else {
    if (SVar1 != OT_USERDATA) {
      sq_throwerror(v,"invalid object type");
      return -1;
    }
    ((pSVar2->super_SQObject)._unVal.pUserData)->_typetag = typetag;
  }
  return 0;
}

Assistant:

SQRESULT sq_settypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer typetag)
{
    SQObjectPtr &o = stack_get(v,idx);
    switch(sq_type(o)) {
        case OT_USERDATA:   _userdata(o)->_typetag = typetag;   break;
        case OT_CLASS:      _class(o)->_typetag = typetag;      break;
        default:            return sq_throwerror(v,_SC("invalid object type"));
    }
    return SQ_OK;
}